

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::compute_persistent_cohomology
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Filtration_value min_interval_length)

{
  vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
  *this_00;
  Simplex_handle *pSVar1;
  Simplex_handle sh;
  pointer puVar2;
  uint dim_sigma;
  Filtration_simplex_range *pFVar3;
  Simplex_key SVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  pointer puVar7;
  __node_base *p_Var8;
  Simplex_handle *pSVar9;
  Simplex_key idx_fil;
  Simplex_key key;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertices;
  unsigned_long local_88;
  unsigned_long local_80;
  value_type_conflict2 local_78;
  int local_6c;
  Simplex_key local_68;
  _Base_ptr p_Stack_60;
  _Base_ptr local_58 [2];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (0 < this->dim_max_) {
    (this->interval_length_policy).min_length_ = min_interval_length;
    local_78 = 0xffffffffffffffff;
    local_48._M_impl.super__Vector_impl_data._M_start = (Simplex_key *)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (Simplex_key *)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar3 = cubical_complex::
             Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
             filtration_simplex_range(this->cpx_);
    pSVar1 = (pFVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar9 = (pFVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar2 = local_48._M_impl.super__Vector_impl_data._M_finish, pSVar9 != pSVar1;
        pSVar9 = pSVar9 + 1) {
      sh = *pSVar9;
      local_78 = local_78 + 1;
      cubical_complex::
      Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
      assign_key(this->cpx_,sh,local_78);
      SVar4 = cubical_complex::
              Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
              key(this->cpx_,sh);
      (this->dsets_).parent[SVar4] = SVar4;
      (this->dsets_).rank[SVar4] = 0;
      dim_sigma = cubical_complex::
                  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                  ::dimension(this->cpx_,sh);
      if (dim_sigma == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&local_78);
      }
      else if (dim_sigma == 1) {
        update_cohomology_groups_edge(this,sh);
      }
      else {
        update_cohomology_groups(this,sh,dim_sigma);
      }
    }
    this_00 = &this->persistent_pairs_;
    for (puVar7 = local_48._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2;
        puVar7 = puVar7 + 1) {
      local_68 = *puVar7;
      if ((this->ds_parent_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[local_68] == local_68) {
        iVar5 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->zero_cocycles_)._M_h,&local_68);
        if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
            _M_cur == (__node_type *)0x0) {
          local_80 = cubical_complex::
                     Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                     ::simplex(this->cpx_,local_68);
          local_88 = 0xffffffffffffffff;
          local_6c = (this->coeff_field_).Prime;
          std::
          vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
          ::emplace_back<unsigned_long,unsigned_long,int>
                    ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                      *)this_00,&local_80,&local_88,&local_6c);
        }
      }
    }
    p_Var8 = &(this->zero_cocycles_)._M_h._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      local_68 = cubical_complex::
                 Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                 ::simplex(this->cpx_,
                           (Simplex_key)
                           *(_Hash_node_base **)
                            &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor);
      local_80 = 0xffffffffffffffff;
      local_88 = CONCAT44(local_88._4_4_,(this->coeff_field_).Prime);
      std::
      vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
      ::emplace_back<unsigned_long,unsigned_long,int>
                ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                  *)this_00,&local_68,&local_80,(int *)&local_88);
    }
    for (p_Var6 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      local_58[0] = p_Var6[1]._M_left;
      local_68 = *(Simplex_key *)(p_Var6 + 1);
      p_Stack_60 = p_Var6[1]._M_parent;
      local_80 = cubical_complex::
                 Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                 ::simplex(this->cpx_,local_68);
      local_88 = 0xffffffffffffffff;
      std::
      vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
      ::emplace_back<unsigned_long,unsigned_long,int&>
                ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                  *)this_00,&local_80,&local_88,(int *)local_58);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void compute_persistent_cohomology(Filtration_value min_interval_length = 0) {
    if (dim_max_ <= 0)
      return;  // --------->>

    interval_length_policy.set_length(min_interval_length);
    Simplex_key idx_fil = -1;
    std::vector<Simplex_key> vertices; // so we can check the connected components at the end
    // Compute all finite intervals
    for (auto sh : cpx_->filtration_simplex_range()) {
      cpx_->assign_key(sh, ++idx_fil);
      dsets_.make_set(cpx_->key(sh));
      int dim_simplex = cpx_->dimension(sh);
      switch (dim_simplex) {
        case 0:
          vertices.push_back(idx_fil);
          break;
        case 1:
          update_cohomology_groups_edge(sh);
          break;
        default:
          update_cohomology_groups(sh, dim_simplex);
          break;
      }
    }
    // Compute infinite intervals of dimension 0
    for (Simplex_key key : vertices) {  // for all 0-dimensional simplices
      if (ds_parent_[key] == key  // root of its tree
      && zero_cocycles_.find(key) == zero_cocycles_.end()) {
        persistent_pairs_.emplace_back(
            cpx_->simplex(key), cpx_->null_simplex(), coeff_field_.characteristic());
      }
    }
    for (auto zero_idx : zero_cocycles_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(zero_idx.second), cpx_->null_simplex(), coeff_field_.characteristic());
    }
    // Compute infinite interval of dimension > 0
    for (auto cocycle : transverse_idx_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(cocycle.first), cpx_->null_simplex(), cocycle.second.characteristics_);
    }
  }